

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_decompress4X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 int flags)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined2 uVar4;
  long lVar5;
  char cVar6;
  size_t sVar7;
  ulong uVar8;
  undefined1 *puVar9;
  byte bVar10;
  uint uVar11;
  undefined1 *puVar12;
  int iVar13;
  undefined1 *puVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined4 in_register_0000008c;
  undefined1 *puVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 *puVar22;
  void *pvVar23;
  ulong uVar24;
  bool bVar25;
  BIT_DStream_t BStack_178;
  BIT_DStream_t BStack_150;
  BIT_DStream_t BStack_128;
  BIT_DStream_t BStack_100;
  ulong uStack_d8;
  size_t sStack_d0;
  HUF_DTable *pHStack_c8;
  undefined1 *puStack_c0;
  size_t *psStack_b8;
  size_t sStack_b0;
  undefined1 *puStack_a8;
  undefined1 *puStack_a0;
  size_t sStack_90;
  size_t *psStack_88;
  size_t *psStack_80;
  size_t *psStack_70;
  size_t sStack_68;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar7 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,flags);
    return sVar7;
  }
  if ((flags & 1U) != 0) {
    if (((flags & 0x20U) == 0) &&
       (sVar7 = HUF_decompress4X1_usingDTable_internal_fast
                          (dst,maxDstSize,cSrc,cSrcSize,DTable,
                           (HUF_DecompressFastLoopFn)CONCAT44(in_register_0000008c,flags)),
       sVar7 != 0)) {
      return sVar7;
    }
    sVar7 = HUF_decompress4X1_usingDTable_internal_bmi2(dst,maxDstSize,cSrc,cSrcSize,DTable);
    return sVar7;
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar21 = (ulong)*cSrc;
  uVar20 = (ulong)*(ushort *)((long)cSrc + 2);
  uVar19 = (ulong)*(ushort *)((long)cSrc + 4);
  uVar8 = uVar21 + uVar20 + uVar19 + 6;
  if (maxDstSize < 6) {
    return 0xffffffffffffffec;
  }
  if (cSrcSize < uVar8) {
    return 0xffffffffffffffec;
  }
  puStack_a8 = (undefined1 *)((long)dst + maxDstSize);
  uStack_d8 = maxDstSize + 3 >> 2;
  puStack_a0 = (undefined1 *)((long)dst + uStack_d8);
  puVar12 = puStack_a0 + uStack_d8;
  puStack_c0 = puVar12 + uStack_d8;
  if (puStack_a8 < puStack_c0) {
    return 0xffffffffffffffec;
  }
  uVar4 = *(undefined2 *)((long)DTable + 2);
  pHStack_c8 = DTable;
  sStack_68 = maxDstSize;
  sVar7 = BIT_initDStream(&BStack_100,(void *)((long)cSrc + 6),uVar21);
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  pvVar23 = (void *)((long)cSrc + uVar21 + 6);
  sVar7 = BIT_initDStream(&BStack_128,pvVar23,uVar20);
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  pvVar23 = (void *)((long)pvVar23 + uVar20);
  sVar7 = BIT_initDStream(&BStack_150,pvVar23,uVar19);
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  sVar7 = BIT_initDStream(&BStack_178,(void *)((long)pvVar23 + uVar19),cSrcSize - uVar8);
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  puVar9 = (undefined1 *)((long)dst + (sStack_68 - 3));
  cVar6 = (char)uVar4;
  puVar14 = puVar12;
  puVar18 = puStack_c0;
  puVar22 = puStack_a0;
  if (7 < (ulong)((long)puStack_a8 - (long)puStack_c0)) {
    sStack_d0 = BStack_150.bitContainer;
    sStack_90 = BStack_178.bitContainer;
    bVar10 = -cVar6 & 0x3f;
    psStack_88 = (size_t *)BStack_100.ptr;
    psStack_80 = (size_t *)BStack_128.ptr;
    psStack_b8 = (size_t *)BStack_150.ptr;
    lVar5 = uStack_d8 * 3;
    bVar25 = true;
    while (((undefined1 *)((long)dst + lVar5) < puVar9 && (bVar25))) {
      uVar8 = (BStack_100.bitContainer << ((byte)BStack_100.bitsConsumed & 0x3f)) >> bVar10;
      uVar20 = (BStack_128.bitContainer << ((byte)BStack_128.bitsConsumed & 0x3f)) >> bVar10;
      uVar21 = (sStack_d0 << ((byte)BStack_150.bitsConsumed & 0x3f)) >> bVar10;
      uVar19 = (sStack_90 << ((byte)BStack_178.bitsConsumed & 0x3f)) >> bVar10;
      iVar17 = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + BStack_100.bitsConsumed;
      *(undefined1 *)dst = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      iVar16 = *(byte *)((long)pHStack_c8 + uVar20 * 2 + 4) + BStack_128.bitsConsumed;
      *(undefined1 *)((long)dst + uStack_d8) = *(undefined1 *)((long)pHStack_c8 + uVar20 * 2 + 5);
      iVar15 = *(byte *)((long)pHStack_c8 + uVar21 * 2 + 4) + BStack_150.bitsConsumed;
      *(undefined1 *)((long)dst + uStack_d8 * 2) =
           *(undefined1 *)((long)pHStack_c8 + uVar21 * 2 + 5);
      uVar8 = (BStack_100.bitContainer << ((byte)iVar17 & 0x3f)) >> bVar10;
      uVar20 = (BStack_128.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar13 = *(byte *)((long)pHStack_c8 + uVar19 * 2 + 4) + BStack_178.bitsConsumed;
      uVar24 = (sStack_d0 << ((byte)iVar15 & 0x3f)) >> bVar10;
      uVar21 = (sStack_90 << ((byte)iVar13 & 0x3f)) >> bVar10;
      *(undefined1 *)((long)dst + lVar5) = *(undefined1 *)((long)pHStack_c8 + uVar19 * 2 + 5);
      iVar17 = (uint)*(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + iVar17;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      iVar16 = (uint)*(byte *)((long)pHStack_c8 + uVar20 * 2 + 4) + iVar16;
      *(undefined1 *)((long)dst + uStack_d8 + 1) =
           *(undefined1 *)((long)pHStack_c8 + uVar20 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)pHStack_c8 + uVar24 * 2 + 4) + iVar15;
      *(undefined1 *)((long)dst + uStack_d8 * 2 + 1) =
           *(undefined1 *)((long)pHStack_c8 + uVar24 * 2 + 5);
      iVar13 = (uint)*(byte *)((long)pHStack_c8 + uVar21 * 2 + 4) + iVar13;
      *(undefined1 *)((long)dst + lVar5 + 1) = *(undefined1 *)((long)pHStack_c8 + uVar21 * 2 + 5);
      uVar8 = (BStack_100.bitContainer << ((byte)iVar17 & 0x3f)) >> bVar10;
      uVar19 = (BStack_128.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar17 = (uint)*(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + iVar17;
      uVar20 = (sStack_d0 << ((byte)iVar15 & 0x3f)) >> bVar10;
      uVar21 = (sStack_90 << ((byte)iVar13 & 0x3f)) >> bVar10;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      iVar16 = (uint)*(byte *)((long)pHStack_c8 + uVar19 * 2 + 4) + iVar16;
      *(undefined1 *)((long)dst + uStack_d8 + 2) =
           *(undefined1 *)((long)pHStack_c8 + uVar19 * 2 + 5);
      iVar15 = (uint)*(byte *)((long)pHStack_c8 + uVar20 * 2 + 4) + iVar15;
      *(undefined1 *)((long)dst + uStack_d8 * 2 + 2) =
           *(undefined1 *)((long)pHStack_c8 + uVar20 * 2 + 5);
      iVar13 = (uint)*(byte *)((long)pHStack_c8 + uVar21 * 2 + 4) + iVar13;
      *(undefined1 *)((long)dst + lVar5 + 2) = *(undefined1 *)((long)pHStack_c8 + uVar21 * 2 + 5);
      uVar8 = (BStack_100.bitContainer << ((byte)iVar17 & 0x3f)) >> bVar10;
      BStack_100.bitsConsumed = (uint)*(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + iVar17;
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      uVar8 = (BStack_128.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      bVar1 = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4);
      *(undefined1 *)((long)dst + uStack_d8 + 3) = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5)
      ;
      uVar8 = (sStack_d0 << ((byte)iVar15 & 0x3f)) >> bVar10;
      bVar2 = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4);
      *(undefined1 *)((long)dst + uStack_d8 * 2 + 3) =
           *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      uVar8 = (sStack_90 << ((byte)iVar13 & 0x3f)) >> bVar10;
      bVar3 = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4);
      *(undefined1 *)((long)dst + lVar5 + 3) = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      if (psStack_88 < BStack_100.limitPtr) {
        iVar17 = 3;
        sStack_b0 = BStack_100.bitContainer;
      }
      else {
        psStack_88 = (size_t *)((long)psStack_88 - (ulong)(BStack_100.bitsConsumed >> 3));
        BStack_100.bitsConsumed = BStack_100.bitsConsumed & 7;
        sStack_b0 = *psStack_88;
        iVar17 = 0;
      }
      BStack_128.bitsConsumed = iVar16 + (uint)bVar1;
      if (psStack_80 < BStack_128.limitPtr) {
        iVar16 = 3;
      }
      else {
        psStack_80 = (size_t *)((long)psStack_80 - (ulong)(BStack_128.bitsConsumed >> 3));
        BStack_128.bitsConsumed = BStack_128.bitsConsumed & 7;
        BStack_128.bitContainer = *psStack_80;
        iVar16 = 0;
      }
      BStack_150.bitsConsumed = iVar15 + (uint)bVar2;
      if (psStack_b8 < BStack_150.limitPtr) {
        iVar15 = 3;
      }
      else {
        psStack_b8 = (size_t *)((long)psStack_b8 - (ulong)(BStack_150.bitsConsumed >> 3));
        BStack_150.bitsConsumed = BStack_150.bitsConsumed & 7;
        sStack_d0 = *psStack_b8;
        iVar15 = 0;
      }
      BStack_178.bitsConsumed = iVar13 + (uint)bVar3;
      if (BStack_178.ptr < BStack_178.limitPtr) {
        iVar13 = 3;
        psStack_70 = (size_t *)BStack_178.ptr;
      }
      else {
        psStack_70 = (size_t *)((long)BStack_178.ptr - (ulong)(BStack_178.bitsConsumed >> 3));
        BStack_178.bitsConsumed = BStack_178.bitsConsumed & 7;
        sStack_90 = *psStack_70;
        iVar13 = 0;
      }
      dst = (void *)((long)dst + 4);
      bVar25 = ((iVar16 == 0 && iVar17 == 0) && iVar15 == 0) && iVar13 == 0;
      BStack_100.bitContainer = sStack_b0;
      BStack_178.ptr = (char *)psStack_70;
    }
    BStack_100.ptr = (char *)psStack_88;
    BStack_128.ptr = (char *)psStack_80;
    BStack_150.ptr = (char *)psStack_b8;
    BStack_150.bitContainer = sStack_d0;
    BStack_178.bitContainer = sStack_90;
    puVar14 = (undefined1 *)((long)dst + uStack_d8 * 2);
    puVar18 = (undefined1 *)((long)dst + lVar5);
    puVar22 = (undefined1 *)((long)dst + uStack_d8);
  }
  if (puStack_c0 < puVar14 || (puVar12 < puVar22 || puStack_a0 < dst)) {
    return 0xffffffffffffffec;
  }
  if ((long)puStack_a0 - (long)dst < 4) {
    if (BStack_100.bitsConsumed < 0x41) {
      if (BStack_100.ptr < BStack_100.limitPtr) {
        if (BStack_100.ptr == BStack_100.start) goto LAB_001a20fe;
        uVar11 = (int)BStack_100.ptr - (int)BStack_100.start;
        if (BStack_100.start <=
            (size_t *)((long)BStack_100.ptr - (ulong)(BStack_100.bitsConsumed >> 3))) {
          uVar11 = BStack_100.bitsConsumed >> 3;
        }
        BStack_100.bitsConsumed = BStack_100.bitsConsumed + uVar11 * -8;
      }
      else {
        uVar11 = BStack_100.bitsConsumed >> 3;
        BStack_100.bitsConsumed = BStack_100.bitsConsumed & 7;
      }
      BStack_100.ptr = (char *)((long)BStack_100.ptr - (ulong)uVar11);
      BStack_100.bitContainer = *(size_t *)BStack_100.ptr;
    }
  }
  else {
    bVar10 = -cVar6 & 0x3f;
    while (BStack_100.bitsConsumed < 0x41) {
      if (BStack_100.ptr < BStack_100.limitPtr) {
        if (BStack_100.ptr == BStack_100.start) break;
        bVar25 = BStack_100.start <=
                 (size_t *)((long)BStack_100.ptr - (ulong)(BStack_100.bitsConsumed >> 3));
        uVar8 = (ulong)(uint)((int)BStack_100.ptr - (int)BStack_100.start);
        if (bVar25) {
          uVar8 = (ulong)(BStack_100.bitsConsumed >> 3);
        }
        BStack_100.bitsConsumed = BStack_100.bitsConsumed + (int)uVar8 * -8;
      }
      else {
        uVar8 = (ulong)(BStack_100.bitsConsumed >> 3);
        BStack_100.bitsConsumed = BStack_100.bitsConsumed & 7;
        bVar25 = true;
      }
      BStack_100.ptr = (char *)((long)BStack_100.ptr - uVar8);
      BStack_100.bitContainer = *(size_t *)BStack_100.ptr;
      if ((puStack_a0 + -3 <= dst) || (!bVar25)) break;
      uVar8 = (BStack_100.bitContainer << ((byte)BStack_100.bitsConsumed & 0x3f)) >> bVar10;
      iVar16 = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + BStack_100.bitsConsumed;
      *(undefined1 *)dst = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      uVar8 = (BStack_100.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + iVar16;
      *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      uVar8 = (BStack_100.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + iVar16;
      *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      uVar8 = (BStack_100.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      bVar1 = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4);
      *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      dst = (void *)((long)dst + 4);
      BStack_100.bitsConsumed = (uint)bVar1 + iVar16;
    }
  }
LAB_001a20fe:
  bVar10 = -cVar6 & 0x3f;
  for (; dst < puStack_a0; dst = (void *)((long)dst + 1)) {
    uVar8 = (BStack_100.bitContainer << ((byte)BStack_100.bitsConsumed & 0x3f)) >> bVar10;
    BStack_100.bitsConsumed = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + BStack_100.bitsConsumed;
    *(undefined1 *)dst = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
  }
  if ((long)puVar12 - (long)puVar22 < 4) {
    if (BStack_128.bitsConsumed < 0x41) {
      if (BStack_128.ptr < BStack_128.limitPtr) {
        if (BStack_128.ptr == BStack_128.start) goto LAB_001a2357;
        uVar11 = (int)BStack_128.ptr - (int)BStack_128.start;
        if (BStack_128.start <=
            (size_t *)((long)BStack_128.ptr - (ulong)(BStack_128.bitsConsumed >> 3))) {
          uVar11 = BStack_128.bitsConsumed >> 3;
        }
        BStack_128.bitsConsumed = BStack_128.bitsConsumed + uVar11 * -8;
      }
      else {
        uVar11 = BStack_128.bitsConsumed >> 3;
        BStack_128.bitsConsumed = BStack_128.bitsConsumed & 7;
      }
      BStack_128.ptr = (char *)((long)BStack_128.ptr - (ulong)uVar11);
      BStack_128.bitContainer = *(size_t *)BStack_128.ptr;
    }
  }
  else {
    while (BStack_128.bitsConsumed < 0x41) {
      if (BStack_128.ptr < BStack_128.limitPtr) {
        if (BStack_128.ptr == BStack_128.start) break;
        bVar25 = BStack_128.start <=
                 (size_t *)((long)BStack_128.ptr - (ulong)(BStack_128.bitsConsumed >> 3));
        uVar11 = (int)BStack_128.ptr - (int)BStack_128.start;
        if (bVar25) {
          uVar11 = BStack_128.bitsConsumed >> 3;
        }
        BStack_128.bitsConsumed = BStack_128.bitsConsumed + uVar11 * -8;
      }
      else {
        uVar11 = BStack_128.bitsConsumed >> 3;
        BStack_128.bitsConsumed = BStack_128.bitsConsumed & 7;
        bVar25 = true;
      }
      BStack_128.ptr = (char *)((long)BStack_128.ptr - (ulong)uVar11);
      BStack_128.bitContainer = *(size_t *)BStack_128.ptr;
      if ((puVar12 + -3 <= puVar22) || (!bVar25)) break;
      uVar8 = (BStack_128.bitContainer << ((byte)BStack_128.bitsConsumed & 0x3f)) >> bVar10;
      iVar16 = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + BStack_128.bitsConsumed;
      *puVar22 = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      uVar8 = (BStack_128.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + iVar16;
      puVar22[1] = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      uVar8 = (BStack_128.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + iVar16;
      puVar22[2] = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      uVar8 = (BStack_128.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      bVar1 = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4);
      puVar22[3] = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      puVar22 = puVar22 + 4;
      BStack_128.bitsConsumed = (uint)bVar1 + iVar16;
    }
  }
LAB_001a2357:
  for (; puVar22 < puVar12; puVar22 = puVar22 + 1) {
    uVar8 = (BStack_128.bitContainer << ((byte)BStack_128.bitsConsumed & 0x3f)) >> bVar10;
    BStack_128.bitsConsumed = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + BStack_128.bitsConsumed;
    *puVar22 = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
  }
  if ((long)puStack_c0 - (long)puVar14 < 4) {
    if (BStack_150.bitsConsumed < 0x41) {
      if (BStack_150.ptr < BStack_150.limitPtr) {
        if (BStack_150.ptr == BStack_150.start) goto LAB_001a2532;
        uVar11 = (int)BStack_150.ptr - (int)BStack_150.start;
        if (BStack_150.start <=
            (size_t *)((long)BStack_150.ptr - (ulong)(BStack_150.bitsConsumed >> 3))) {
          uVar11 = BStack_150.bitsConsumed >> 3;
        }
        BStack_150.bitsConsumed = BStack_150.bitsConsumed + uVar11 * -8;
      }
      else {
        uVar11 = BStack_150.bitsConsumed >> 3;
        BStack_150.bitsConsumed = BStack_150.bitsConsumed & 7;
      }
      BStack_150.ptr = (char *)((long)BStack_150.ptr - (ulong)uVar11);
      BStack_150.bitContainer = *(size_t *)BStack_150.ptr;
    }
  }
  else {
    while (BStack_150.bitsConsumed < 0x41) {
      if (BStack_150.ptr < BStack_150.limitPtr) {
        if (BStack_150.ptr == BStack_150.start) break;
        bVar25 = BStack_150.start <=
                 (size_t *)((long)BStack_150.ptr - (ulong)(BStack_150.bitsConsumed >> 3));
        uVar11 = (int)BStack_150.ptr - (int)BStack_150.start;
        if (bVar25) {
          uVar11 = BStack_150.bitsConsumed >> 3;
        }
        BStack_150.bitsConsumed = BStack_150.bitsConsumed + uVar11 * -8;
      }
      else {
        uVar11 = BStack_150.bitsConsumed >> 3;
        BStack_150.bitsConsumed = BStack_150.bitsConsumed & 7;
        bVar25 = true;
      }
      BStack_150.ptr = (char *)((long)BStack_150.ptr - (ulong)uVar11);
      BStack_150.bitContainer = *(size_t *)BStack_150.ptr;
      if ((puStack_c0 + -3 <= puVar14) || (!bVar25)) break;
      uVar8 = (BStack_150.bitContainer << ((byte)BStack_150.bitsConsumed & 0x3f)) >> bVar10;
      iVar16 = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + BStack_150.bitsConsumed;
      *puVar14 = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      uVar8 = (BStack_150.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + iVar16;
      puVar14[1] = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      uVar8 = (BStack_150.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + iVar16;
      puVar14[2] = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      uVar8 = (BStack_150.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      bVar1 = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4);
      puVar14[3] = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      puVar14 = puVar14 + 4;
      BStack_150.bitsConsumed = (uint)bVar1 + iVar16;
    }
  }
LAB_001a2532:
  for (; puVar14 < puStack_c0; puVar14 = puVar14 + 1) {
    uVar8 = (BStack_150.bitContainer << ((byte)BStack_150.bitsConsumed & 0x3f)) >> bVar10;
    BStack_150.bitsConsumed = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + BStack_150.bitsConsumed;
    *puVar14 = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
  }
  if ((long)puStack_a8 - (long)puVar18 < 4) {
    if (BStack_178.bitsConsumed < 0x41) {
      if (BStack_178.ptr < BStack_178.limitPtr) {
        if (BStack_178.ptr == BStack_178.start) goto LAB_001a2704;
        uVar11 = (int)BStack_178.ptr - (int)BStack_178.start;
        if (BStack_178.start <=
            (size_t *)((long)BStack_178.ptr - (ulong)(BStack_178.bitsConsumed >> 3))) {
          uVar11 = BStack_178.bitsConsumed >> 3;
        }
        BStack_178.bitsConsumed = BStack_178.bitsConsumed + uVar11 * -8;
      }
      else {
        uVar11 = BStack_178.bitsConsumed >> 3;
        BStack_178.bitsConsumed = BStack_178.bitsConsumed & 7;
      }
      BStack_178.ptr = (char *)((long)BStack_178.ptr - (ulong)uVar11);
      BStack_178.bitContainer = *(size_t *)BStack_178.ptr;
    }
  }
  else {
    while (BStack_178.bitsConsumed < 0x41) {
      if (BStack_178.ptr < BStack_178.limitPtr) {
        if (BStack_178.ptr == BStack_178.start) break;
        bVar25 = BStack_178.start <=
                 (size_t *)((long)BStack_178.ptr - (ulong)(BStack_178.bitsConsumed >> 3));
        uVar11 = (int)BStack_178.ptr - (int)BStack_178.start;
        if (bVar25) {
          uVar11 = BStack_178.bitsConsumed >> 3;
        }
        BStack_178.bitsConsumed = BStack_178.bitsConsumed + uVar11 * -8;
      }
      else {
        uVar11 = BStack_178.bitsConsumed >> 3;
        BStack_178.bitsConsumed = BStack_178.bitsConsumed & 7;
        bVar25 = true;
      }
      BStack_178.ptr = (char *)((long)BStack_178.ptr - (ulong)uVar11);
      BStack_178.bitContainer = *(size_t *)BStack_178.ptr;
      if ((puVar9 <= puVar18) || (!bVar25)) break;
      uVar8 = (BStack_178.bitContainer << ((byte)BStack_178.bitsConsumed & 0x3f)) >> bVar10;
      iVar16 = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + BStack_178.bitsConsumed;
      *puVar18 = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      uVar8 = (BStack_178.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + iVar16;
      puVar18[1] = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      uVar8 = (BStack_178.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      iVar16 = (uint)*(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + iVar16;
      puVar18[2] = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      uVar8 = (BStack_178.bitContainer << ((byte)iVar16 & 0x3f)) >> bVar10;
      bVar1 = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4);
      puVar18[3] = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
      puVar18 = puVar18 + 4;
      BStack_178.bitsConsumed = (uint)bVar1 + iVar16;
    }
  }
LAB_001a2704:
  for (; puVar18 < puStack_a8; puVar18 = puVar18 + 1) {
    uVar8 = (BStack_178.bitContainer << ((byte)BStack_178.bitsConsumed & 0x3f)) >> bVar10;
    BStack_178.bitsConsumed = *(byte *)((long)pHStack_c8 + uVar8 * 2 + 4) + BStack_178.bitsConsumed;
    *puVar18 = *(undefined1 *)((long)pHStack_c8 + uVar8 * 2 + 5);
  }
  sVar7 = 0xffffffffffffffec;
  if (BStack_178.bitsConsumed != 0x40) {
    sStack_68 = sVar7;
  }
  if (BStack_178.ptr != BStack_178.start) {
    sStack_68 = sVar7;
  }
  if (BStack_150.bitsConsumed != 0x40) {
    sStack_68 = sVar7;
  }
  if (BStack_150.ptr != BStack_150.start) {
    sStack_68 = sVar7;
  }
  if (BStack_128.bitsConsumed != 0x40) {
    sStack_68 = sVar7;
  }
  if (BStack_128.ptr != BStack_128.start) {
    sStack_68 = sVar7;
  }
  if (BStack_100.bitsConsumed != 0x40) {
    sStack_68 = sVar7;
  }
  if (BStack_100.ptr != BStack_100.start) {
    return 0xffffffffffffffec;
  }
  return sStack_68;
}

Assistant:

size_t HUF_decompress4X_usingDTable(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int flags)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, flags);
#endif
}